

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

set<uint256,_std::less<uint256>,_std::allocator<uint256>_> * __thiscall
wallet::CWallet::GetTxConflicts(CWallet *this,CWalletTx *wtx)

{
  uint256 *puVar1;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *in_RDI;
  long in_FS_OFFSET;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *result;
  uint256 myHash;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  key_type *in_stack_ffffffffffffff80;
  CWallet *this_00;
  
  this_00 = *(CWallet **)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RDI,(char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             (AnnotatedMixin<std::recursive_mutex> *)0xae3b51);
  CWalletTx::GetHash((CWalletTx *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  puVar1 = transaction_identifier::operator_cast_to_uint256_
                     ((transaction_identifier<false> *)
                      CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  GetConflicts(this_00,*(uint256 **)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18));
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::erase
            (in_RDI,in_stack_ffffffffffffff80);
  if (*(CWallet **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::set<uint256> CWallet::GetTxConflicts(const CWalletTx& wtx) const
{
    AssertLockHeld(cs_wallet);

    const uint256 myHash{wtx.GetHash()};
    std::set<uint256> result{GetConflicts(myHash)};
    result.erase(myHash);
    return result;
}